

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Reader __thiscall
capnp::_::PointerReader::getBlob<capnp::Data>
          (PointerReader *this,void *defaultValue,ByteCount defaultSize)

{
  WirePointer *pWVar1;
  WirePointer *pWVar2;
  word *pwVar3;
  Arena *pAVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar9;
  WirePointer *pWVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  WirePointer *pWVar15;
  ulong uVar16;
  WirePointer *pWVar17;
  Reader RVar18;
  ThrowOverflow local_31;
  Fault f;
  SegmentReader *pSVar8;
  
  pSVar8 = this->segment;
  pWVar17 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar17 = this->pointer;
  }
  uVar6 = assertMaxBits<29u,unsigned_int,kj::ThrowOverflow>(defaultSize,&local_31);
  pWVar1 = pWVar17 + 1;
  uVar11 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
  lVar13 = (long)((int)uVar11 >> 2);
  pWVar15 = (WirePointer *)defaultValue;
  uVar12 = uVar6;
  if (pSVar8 == (SegmentReader *)0x0) {
    if (uVar11 == 0 && (pWVar17->field_1).upper32Bits == 0) goto LAB_001ed68f;
    pWVar10 = pWVar1 + lVar13;
    pSVar8 = (SegmentReader *)0x0;
LAB_001ed62d:
    uVar11 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
LAB_001ed633:
    if ((uVar11 & 3) == 1) {
      if (((pWVar17->field_1).upper32Bits & 7) == 2) {
        uVar12 = (pWVar17->field_1).upper32Bits >> 3;
        pWVar15 = pWVar10;
        if (pSVar8 == (SegmentReader *)0x0) goto LAB_001ed68f;
        uVar14 = (ulong)(uVar12 + 7 >> 3);
        if (((long)pWVar10 - (long)(pSVar8->ptr).ptr >> 3) + uVar14 <= (pSVar8->ptr).size_) {
          uVar9 = pSVar8->readLimiter->limit;
          if (uVar14 <= uVar9) {
            pSVar8->readLimiter->limit = uVar9 - uVar14;
            goto LAB_001ed68f;
          }
          (*pSVar8->arena->_vptr_Arena[3])();
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9c0,FAILED,"boundsCheck(segment, ptr, roundBytesUpToWords(size))",
                   "\"Message contained out-of-bounds data pointer.\"",
                   (char (*) [46])"Message contained out-of-bounds data pointer.");
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[68]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9bb,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                   "\"Message contains list pointer of non-bytes where data was expected.\"",
                   (char (*) [68])
                   "Message contains list pointer of non-bytes where data was expected.");
      }
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[59]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x9b6,FAILED,"ref->kind() == WirePointer::LIST",
                 "\"Message contains non-list pointer where data was expected.\"",
                 (char (*) [59])"Message contains non-list pointer where data was expected.");
    }
  }
  else {
    pwVar3 = (pSVar8->ptr).ptr;
    pWVar2 = (WirePointer *)(pwVar3 + (pSVar8->ptr).size_);
    pWVar10 = pWVar1 + lVar13;
    if ((long)pWVar2 - (long)pWVar1 >> 3 < lVar13) {
      pWVar10 = pWVar2;
    }
    if (lVar13 < (long)pwVar3 - (long)pWVar1 >> 3) {
      pWVar10 = pWVar2;
    }
    if ((pWVar17->field_1).upper32Bits == 0 && uVar11 == 0) goto LAB_001ed68f;
    if (pSVar8 == (SegmentReader *)0x0) {
      pSVar8 = (SegmentReader *)0x0;
LAB_001ed628:
      if (pWVar10 == (WirePointer *)0x0) goto LAB_001ed68f;
      goto LAB_001ed62d;
    }
    if ((uVar11 & 3) != 2) goto LAB_001ed628;
    iVar7 = (*pSVar8->arena->_vptr_Arena[2])();
    pSVar8 = (SegmentReader *)CONCAT44(extraout_var,iVar7);
    if (pSVar8 != (SegmentReader *)0x0) {
      uVar14 = (pSVar8->ptr).size_;
      uVar11 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
      uVar9 = (ulong)(uVar11 >> 3);
      if ((long)uVar14 < (long)(ulong)(uVar11 >> 3)) {
        uVar9 = uVar14;
      }
      uVar16 = 2 - (ulong)((uVar11 & 4) == 0);
      if (uVar14 < uVar9 + uVar16) {
LAB_001ed791:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x23c,FAILED,"boundsCheck(segment, ptr, padWords)",
                   "\"Message contains out-of-bounds far pointer.\"",
                   (char (*) [44])"Message contains out-of-bounds far pointer.");
        goto LAB_001ed7c5;
      }
      pwVar3 = (pSVar8->ptr).ptr;
      pAVar4 = pSVar8->arena;
      uVar5 = pSVar8->readLimiter->limit;
      if (uVar5 < uVar16) {
        (*pAVar4->_vptr_Arena[3])();
        goto LAB_001ed791;
      }
      pWVar17 = (WirePointer *)(pwVar3 + uVar9);
      pWVar1 = pWVar17 + 1;
      pSVar8->readLimiter->limit = uVar5 - uVar16;
      if ((uVar11 & 4) != 0) {
        iVar7 = (*pAVar4->_vptr_Arena[2])(pAVar4,(ulong)(pWVar17->field_1).upper32Bits);
        pSVar8 = (SegmentReader *)CONCAT44(extraout_var_00,iVar7);
        if (pSVar8 == (SegmentReader *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x24e,FAILED,"newSegment != nullptr",
                     "\"Message contains double-far pointer to unknown segment.\"",
                     (char (*) [56])"Message contains double-far pointer to unknown segment.");
        }
        else {
          uVar11 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
          if ((uVar11 & 3) == 2) {
            uVar9 = (ulong)(uVar11 >> 3);
            uVar14 = (pSVar8->ptr).size_;
            if ((long)uVar14 < (long)uVar9) {
              uVar9 = uVar14;
            }
            pWVar10 = (WirePointer *)((pSVar8->ptr).ptr + uVar9);
            pWVar17 = pWVar1;
            goto LAB_001ed628;
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x252,FAILED,"pad->kind() == WirePointer::FAR",
                     "\"Second word of double-far pad must be far pointer.\"",
                     (char (*) [51])"Second word of double-far pad must be far pointer.");
        }
        goto LAB_001ed7c5;
      }
      uVar11 = (uint)*(uint64_t *)&(pWVar17->offsetAndKind).value;
      lVar13 = (long)((int)uVar11 >> 2);
      pWVar10 = (WirePointer *)(pwVar3 + uVar14);
      if ((lVar13 < (long)pwVar3 - (long)pWVar1 >> 3) ||
         ((long)pWVar10 - (long)pWVar1 >> 3 < lVar13)) goto LAB_001ed62d;
      pWVar10 = pWVar1 + lVar13;
      goto LAB_001ed633;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x234,FAILED,"segment != nullptr",
               "\"Message contains far pointer to unknown segment.\"",
               (char (*) [49])"Message contains far pointer to unknown segment.");
  }
LAB_001ed7c5:
  kj::_::Debug::Fault::~Fault(&f);
  pWVar15 = (WirePointer *)defaultValue;
  uVar12 = uVar6;
LAB_001ed68f:
  RVar18.super_ArrayPtr<const_unsigned_char>.size_._0_4_ = uVar12;
  RVar18.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)pWVar15;
  RVar18.super_ArrayPtr<const_unsigned_char>.size_._4_4_ = 0;
  return (Reader)RVar18.super_ArrayPtr<const_unsigned_char>;
}

Assistant:

Data::Reader PointerReader::getBlob<Data>(const void* defaultValue, ByteCount defaultSize) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readDataPointer(segment, ref, defaultValue,
      assertMaxBits<BLOB_SIZE_BITS>(defaultSize, ThrowOverflow()));
}